

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

bool Cipher::loadFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  int iVar1;
  mapped_type *pmVar2;
  int i;
  uint uVar3;
  bool bVar4;
  uint8_t d;
  uint8_t n8;
  TCode curi;
  TProb curp;
  ifstream fin;
  byte local_252;
  byte local_251;
  int local_250;
  mapped_type local_24c;
  int local_248;
  mapped_type local_244;
  int local_240;
  int local_23c;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,fname,_S_bin);
  local_240 = *(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18));
  if (local_240 == 0) {
    std::istream::read((char *)local_238,(long)freqMap);
    std::istream::read((char *)local_238,(long)&freqMap->nTotal);
    std::istream::read((char *)local_238,(long)&freqMap->pmin);
    std::istream::read((char *)local_238,(long)&local_250);
    if (0 < local_250) {
      do {
        std::istream::read((char *)local_238,(long)&local_248);
        std::istream::read((char *)local_238,(long)&local_244);
        local_24c = local_244;
        pmVar2 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&freqMap->prob,&local_248);
        *pmVar2 = local_24c;
        std::istream::read((char *)local_238,(long)&local_251);
        if (local_251 != 0) {
          uVar3 = 0;
          do {
            std::istream::read((char *)local_238,(long)&local_252);
            std::istream::read((char *)local_238,(long)&local_244);
            local_24c = local_244;
            local_23c = (uint)local_252 + local_248;
            pmVar2 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&freqMap->prob,&local_23c);
            *pmVar2 = local_24c;
            local_248 = local_248 + (uint)local_252;
            uVar3 = uVar3 + 1;
          } while (uVar3 < local_251);
          local_250 = local_250 - (uint)local_251;
        }
        iVar1 = local_250 + -1;
        bVar4 = 1 < local_250;
        local_250 = iVar1;
      } while (bVar4);
    }
  }
  else {
    printf("    Failed to open file \'%s\'\n",fname);
  }
  bVar4 = local_240 == 0;
  std::ifstream::~ifstream(local_238);
  return bVar4;
}

Assistant:

bool loadFreqMapBinary(const char * fname, TFreqMap & freqMap) {
        std::ifstream fin(fname, std::ios::binary);
        if (fin.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fin.read((char *) &freqMap.len,    sizeof(freqMap.len));
        fin.read((char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fin.read((char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        {
            int32_t n;
            fin.read((char *) &n, sizeof(n));

            TCode curi;
            TProb curp;

            while (n > 0) {
                fin.read((char *) &curi, sizeof(curi));
                fin.read((char *) &curp, sizeof(curp));
                freqMap.prob[curi] = curp;

                uint8_t n8;
                fin.read((char *) &n8, sizeof(n8));

                if (n8 > 0) {
                    for (int i = 0; i < n8; ++i) {
                        uint8_t d;
                        fin.read((char *) &d,    sizeof(d));
                        fin.read((char *) &curp, sizeof(curp));
                        freqMap.prob[curi + d] = curp;
                        curi += d;
                    }

                    n -= n8;
                }

                --n;
            }
        }

        return true;
    }